

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O3

void __thiscall
boost::deflate::inflate_stream_test::Matrix::operator()(Matrix *this,Boost *f,string *check)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int level;
  uint uVar4;
  int memLevel;
  int in_stack_ffffffffffffff90;
  string local_60;
  IDecompressor local_40;
  Bytef *local_38;
  
  iVar3 = this->level_[1];
  if (this->level_[0] <= iVar3) {
    iVar2 = this->window_[1];
    uVar4 = this->level_[0];
    do {
      if (this->window_[0] <= iVar2) {
        iVar3 = this->strategy_[1];
        level = this->window_[0];
        do {
          memLevel = this->strategy_[0];
          if (this->strategy_[0] <= iVar3) {
            do {
              local_40._vptr_IDecompressor = (_func_int **)(check->_M_dataplus)._M_p;
              local_38 = (Bytef *)check->_M_string_length;
              compress_abi_cxx11_(&local_60,(inflate_stream_test *)&stack0xffffffffffffffc0,
                                  (string_view *)(ulong)uVar4,level,0,4,memLevel,
                                  in_stack_ffffffffffffff90);
              Boost::operator()(f,level,&local_60,check);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              iVar3 = this->strategy_[1];
              bVar1 = memLevel < iVar3;
              memLevel = memLevel + 1;
            } while (bVar1);
            iVar2 = this->window_[1];
          }
          bVar1 = level < iVar2;
          level = level + 1;
        } while (bVar1);
        iVar3 = this->level_[1];
      }
      bVar1 = (int)uVar4 < iVar3;
      uVar4 = uVar4 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void operator()(
            F const& f,
            std::string const& check) const
        {
            for(auto level = level_[0];
                level <= level_[1]; ++level)
            {
                for(auto window = window_[0];
                    window <= window_[1]; ++window)
                {
                    for(auto strategy = strategy_[0];
                        strategy <= strategy_[1]; ++strategy)
                        f(
                            window,
                            compress(check, level, window,boost::deflate::wrap::none, 4, strategy),
                            check);
                }
            }
        }